

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pubsub.hpp
# Opt level: O0

void __thiscall
pstore::brokerface::subscriber<pstore::descriptor_condition_variable>::subscriber
          (subscriber<pstore::descriptor_condition_variable> *this,
          not_null<pstore::brokerface::channel<pstore::descriptor_condition_variable>_*> c)

{
  channel<pstore::descriptor_condition_variable> *pcVar1;
  subscriber<pstore::descriptor_condition_variable> *this_local;
  not_null<pstore::brokerface::channel<pstore::descriptor_condition_variable>_*> c_local;
  
  this_local = (subscriber<pstore::descriptor_condition_variable> *)c.ptr_;
  std::
  queue<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::queue<std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>,void>
            ((queue<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              *)this);
  pcVar1 = pstore::gsl::not_null::operator_cast_to_channel_((not_null *)&this_local);
  this->owner_ = pcVar1;
  this->active_ = true;
  return;
}

Assistant:

explicit subscriber (gsl::not_null<channel<ConditionVariable> *> c) noexcept
                    : owner_{c} {}